

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi_loadf_from_callbacks
                  (stbi_io_callbacks *clbk,void *user,int *x,int *y,int *comp,int req_comp)

{
  float *pfVar1;
  stbi__context s;
  stbi_io_callbacks *in_stack_fffffffffffffee8;
  stbi__context *in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff1c;
  int *in_stack_ffffffffffffff20;
  int *in_stack_ffffffffffffff28;
  int *in_stack_ffffffffffffff30;
  stbi__context *in_stack_ffffffffffffff38;
  
  stbi__start_callbacks(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(void *)0x17a471);
  pfVar1 = stbi__loadf_main(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                            in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                            in_stack_ffffffffffffff1c);
  return pfVar1;
}

Assistant:

STBIDEF float *stbi_loadf_from_callbacks(stbi_io_callbacks const *clbk, void *user, int *x, int *y, int *comp, int req_comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) clbk, user);
   return stbi__loadf_main(&s,x,y,comp,req_comp);
}